

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

void __thiscall
t_dart_generator::generate_dart_bean_boilerplate
          (t_dart_generator *this,ostream *out,t_struct *tstruct)

{
  t_field *this_00;
  bool bVar1;
  reference pptVar2;
  t_type *type_00;
  string *psVar3;
  ostream *poVar4;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  allocator local_1a9;
  string local_1a8;
  string local_188;
  string local_168;
  allocator local_141;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  undefined1 local_c0 [8];
  string cap_name;
  string local_90;
  undefined1 local_70 [8];
  string field_name;
  t_type *type;
  t_field *field;
  t_field **local_38;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_30;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *tstruct_local;
  ostream *out_local;
  t_dart_generator *this_local;
  
  f_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_30);
  local_38 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_30._M_current = local_38;
  while( true ) {
    field = (t_field *)
            std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                      ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&field);
    if (!bVar1) break;
    pptVar2 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    this_00 = *pptVar2;
    type_00 = t_field::get_type(this_00);
    field_name.field_2._8_8_ = t_generator::get_true_type(type_00);
    psVar3 = t_field::get_name_abi_cxx11_(this_00);
    std::__cxx11::string::string((string *)&local_90,(string *)psVar3);
    get_member_name((string *)local_70,this,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string((string *)&local_e0,(string *)local_70);
    get_cap_name((string *)local_c0,this,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"// ");
    poVar4 = std::operator<<(poVar4,(string *)local_70);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    generate_dart_doc(this,out,&this_00->super_t_doc);
    poVar4 = t_generator::indent((t_generator *)this,out);
    type_name_abi_cxx11_(&local_100,this,(t_type *)field_name.field_2._8_8_);
    poVar4 = std::operator<<(poVar4,(string *)&local_100);
    poVar4 = std::operator<<(poVar4," get ");
    poVar4 = std::operator<<(poVar4,(string *)local_70);
    poVar4 = std::operator<<(poVar4," => this._");
    poVar4 = std::operator<<(poVar4,(string *)local_70);
    poVar4 = std::operator<<(poVar4,";");
    std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_100);
    generate_dart_doc(this,out,&this_00->super_t_doc);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"set ");
    poVar4 = std::operator<<(poVar4,(string *)local_70);
    poVar4 = std::operator<<(poVar4,"(");
    type_name_abi_cxx11_(&local_120,this,(t_type *)field_name.field_2._8_8_);
    poVar4 = std::operator<<(poVar4,(string *)&local_120);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,(string *)local_70);
    std::operator<<(poVar4,")");
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_140," ",&local_141);
    scope_up(this,out,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"this._");
    poVar4 = std::operator<<(poVar4,(string *)local_70);
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = std::operator<<(poVar4,(string *)local_70);
    poVar4 = std::operator<<(poVar4,";");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    generate_isset_set(this,out,this_00);
    std::__cxx11::string::string((string *)&local_168,(string *)&endl2_abi_cxx11_);
    scope_down(this,out,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"bool is");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a8,"set",&local_1a9);
    get_cap_name(&local_188,this,&local_1a8);
    poVar4 = std::operator<<(poVar4,(string *)&local_188);
    poVar4 = std::operator<<(poVar4,(string *)local_c0);
    std::operator<<(poVar4,"()");
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    bVar1 = type_can_be_null(this,(t_type *)field_name.field_2._8_8_);
    if (bVar1) {
      poVar4 = std::operator<<(out," => this.");
      poVar4 = std::operator<<(poVar4,(string *)local_70);
      poVar4 = std::operator<<(poVar4," != null;");
      std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
    }
    else {
      poVar4 = std::operator<<(out," => this.__isset_");
      poVar4 = std::operator<<(poVar4,(string *)local_70);
      poVar4 = std::operator<<(poVar4,";");
      std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
    }
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"unset");
    poVar4 = std::operator<<(poVar4,(string *)local_c0);
    std::operator<<(poVar4,"()");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d0," ",&local_1d1);
    scope_up(this,out,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    bVar1 = type_can_be_null(this,(t_type *)field_name.field_2._8_8_);
    if (bVar1) {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"this.");
      poVar4 = std::operator<<(poVar4,(string *)local_70);
      poVar4 = std::operator<<(poVar4," = null;");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    else {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"this.__isset_");
      poVar4 = std::operator<<(poVar4,(string *)local_70);
      poVar4 = std::operator<<(poVar4," = false;");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    std::__cxx11::string::string((string *)&local_1f8,(string *)&endl2_abi_cxx11_);
    scope_down(this,out,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)local_70);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_30);
  }
  return;
}

Assistant:

void t_dart_generator::generate_dart_bean_boilerplate(ostream& out,
                                                    t_struct* tstruct) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* field = *f_iter;
    t_type* type = get_true_type(field->get_type());
    std::string field_name = get_member_name(field->get_name());
    std::string cap_name = get_cap_name(field_name);

    indent(out) << "// " << field_name << endl;

    // Simple getter
    generate_dart_doc(out, field);
    indent(out) << type_name(type) << " get " << field_name << " => this._" << field_name << ";" << endl2;

    // Simple setter
    generate_dart_doc(out, field);
    indent(out) << "set " << field_name << "(" << type_name(type) << " " << field_name << ")";
    scope_up(out);
    indent(out) << "this._" << field_name << " = " << field_name << ";" << endl;
    generate_isset_set(out, field);
    scope_down(out, endl2);

    // isSet method
    indent(out) << "bool is" << get_cap_name("set") << cap_name << "()";
    if (type_can_be_null(type)) {
      out << " => this." << field_name << " != null;" << endl2;
    } else {
      out << " => this.__isset_" << field_name << ";" << endl2;
    }

    // Unsetter
    indent(out) << "unset" << cap_name << "()";
    scope_up(out);
    if (type_can_be_null(type)) {
      indent(out) << "this." << field_name << " = null;" << endl;
    } else {
      indent(out) << "this.__isset_" << field_name << " = false;" << endl;
    }
    scope_down(out, endl2);
  }
}